

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

ArrayPtr<const_char> * __thiscall
kj::Vector<kj::ArrayPtr<char_const>>::add<kj::StringPtr&>
          (Vector<kj::ArrayPtr<char_const>> *this,StringPtr *params)

{
  size_t sVar1;
  ArrayPtr<const_char> *pAVar2;
  undefined8 *puVar3;
  
  puVar3 = *(undefined8 **)(this + 8);
  if (puVar3 == *(undefined8 **)(this + 0x10)) {
    Vector<kj::ArrayPtr<const_char>_>::grow((Vector<kj::ArrayPtr<const_char>_> *)this,0);
    puVar3 = *(undefined8 **)(this + 8);
  }
  sVar1 = (params->content).size_;
  *puVar3 = (params->content).ptr;
  puVar3[1] = sVar1 - 1;
  pAVar2 = *(ArrayPtr<const_char> **)(this + 8);
  *(ArrayPtr<const_char> **)(this + 8) = pAVar2 + 1;
  return pAVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }